

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall
mkvmuxer::Cluster::AddFrameWithDiscardPadding
          (Cluster *this,uint8_t *data,uint64_t length,int64_t discard_padding,uint64_t track_number
          ,uint64_t abs_timecode,bool is_key)

{
  bool bVar1;
  undefined1 local_b0 [8];
  Frame frame;
  bool is_key_local;
  uint64_t abs_timecode_local;
  uint64_t track_number_local;
  int64_t discard_padding_local;
  uint64_t length_local;
  uint8_t *data_local;
  Cluster *this_local;
  
  frame._103_1_ = is_key;
  Frame::Frame((Frame *)local_b0);
  bVar1 = Frame::Init((Frame *)local_b0,data,length);
  if (bVar1) {
    Frame::set_discard_padding((Frame *)local_b0,discard_padding);
    Frame::set_track_number((Frame *)local_b0,track_number);
    Frame::set_timestamp((Frame *)local_b0,abs_timecode);
    Frame::set_is_key((Frame *)local_b0,(bool)(frame._103_1_ & 1));
    this_local._7_1_ = QueueOrWriteFrame(this,(Frame *)local_b0);
  }
  else {
    this_local._7_1_ = false;
  }
  Frame::~Frame((Frame *)local_b0);
  return this_local._7_1_;
}

Assistant:

bool Cluster::AddFrameWithDiscardPadding(const uint8_t* data, uint64_t length,
                                         int64_t discard_padding,
                                         uint64_t track_number,
                                         uint64_t abs_timecode, bool is_key) {
  Frame frame;
  if (!frame.Init(data, length))
    return false;
  frame.set_discard_padding(discard_padding);
  frame.set_track_number(track_number);
  frame.set_timestamp(abs_timecode);
  frame.set_is_key(is_key);
  return QueueOrWriteFrame(&frame);
}